

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O3

UBool utext_moveIndex32_63(UText *ut,int32_t delta)

{
  UBool UVar1;
  int iVar2;
  UChar32 UVar3;
  int iVar4;
  
  if (delta < 1) {
    if (delta < 0) {
      do {
        iVar4 = ut->chunkOffset;
        if (iVar4 < 1) {
          UVar1 = (*ut->pFuncs->access)(ut,ut->chunkNativeStart,'\0');
          if (UVar1 == '\0') {
            return '\0';
          }
          iVar4 = ut->chunkOffset;
        }
        if ((ut->chunkContents[(long)iVar4 + -1] & 0xf800U) == 0xd800) {
          UVar3 = utext_previous32_63(ut);
          if (UVar3 == -1) {
            return '\0';
          }
        }
        else {
          ut->chunkOffset = iVar4 + -1;
        }
        delta = delta + 1;
      } while (delta != 0);
    }
  }
  else {
    iVar4 = delta + 1;
    do {
      iVar2 = ut->chunkOffset;
      if (ut->chunkLength <= iVar2) {
        UVar1 = (*ut->pFuncs->access)(ut,ut->chunkNativeLimit,'\x01');
        if (UVar1 == '\0') {
          return '\0';
        }
        iVar2 = ut->chunkOffset;
      }
      if ((ut->chunkContents[iVar2] & 0xf800U) == 0xd800) {
        UVar3 = utext_next32_63(ut);
        if (UVar3 == -1) {
          return '\0';
        }
      }
      else {
        ut->chunkOffset = iVar2 + 1;
      }
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  }
  return '\x01';
}

Assistant:

U_CAPI UBool U_EXPORT2
utext_moveIndex32(UText *ut, int32_t delta) {
    UChar32  c;
    if (delta > 0) {
        do {
            if(ut->chunkOffset>=ut->chunkLength && !utext_access(ut, ut->chunkNativeLimit, TRUE)) {
                return FALSE;
            }
            c = ut->chunkContents[ut->chunkOffset];
            if (U16_IS_SURROGATE(c)) {
                c = utext_next32(ut);
                if (c == U_SENTINEL) {
                    return FALSE;
                }
            } else {
                ut->chunkOffset++;
            }
        } while(--delta>0);

    } else if (delta<0) {
        do {
            if(ut->chunkOffset<=0 && !utext_access(ut, ut->chunkNativeStart, FALSE)) {
                return FALSE;
            }
            c = ut->chunkContents[ut->chunkOffset-1];
            if (U16_IS_SURROGATE(c)) {
                c = utext_previous32(ut);
                if (c == U_SENTINEL) {
                    return FALSE;
                }
            } else {
                ut->chunkOffset--;
            }
        } while(++delta<0);
    }

    return TRUE;
}